

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O1

Vec_Int_t * Llb_ManDeriveConstraints(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  DdManager *dd;
  Vec_Int_t *vNodes;
  long lVar4;
  long lVar5;
  
  if (p->nTruePos == 1) {
    dd = Llb_ManConstructGlobalBdds(p);
    vNodes = Llb_ManComputeBaseCase(p,dd);
    iVar1 = vNodes->nSize;
    lVar5 = (long)iVar1;
    uVar2 = 0;
    if (0 < lVar5) {
      lVar4 = 0;
      do {
        uVar2 = uVar2 + ((uint)vNodes->pArray[lVar4] < 2);
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
      if (uVar2 != 0) {
        Llb_ManComputeIndCase(p,dd,vNodes);
      }
      iVar3 = 0;
      uVar2 = 0;
      if (0 < iVar1) {
        lVar4 = 0;
        do {
          iVar3 = iVar3 + (uint)((uint)vNodes->pArray[lVar4] < 2);
          lVar4 = lVar4 + 1;
        } while (lVar5 != lVar4);
        uVar2 = (uint)(iVar3 != 0);
      }
    }
    if ((vNodes != (Vec_Int_t *)0x0) && ((char)uVar2 == '\0')) {
      if (vNodes->pArray != (int *)0x0) {
        free(vNodes->pArray);
        vNodes->pArray = (int *)0x0;
      }
      free(vNodes);
      vNodes = (Vec_Int_t *)0x0;
    }
    Llb_ManDerefenceBdds(p,dd);
    Extra_StopManager(dd);
  }
  else {
    vNodes = (Vec_Int_t *)0x0;
    printf("The AIG has %d property outputs.\n");
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Llb_ManDeriveConstraints( Aig_Man_t * p )
{
    DdManager * dd;
    Vec_Int_t * vNodes;
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "The AIG has %d property outputs.\n", Saig_ManPoNum(p) );
        return NULL;
    }
    assert( Saig_ManPoNum(p) == 1 );
    dd = Llb_ManConstructGlobalBdds( p );
    vNodes = Llb_ManComputeBaseCase( p, dd );
    if ( Llb_ManCountEntries(vNodes) > 0 )
        Llb_ManComputeIndCase( p, dd, vNodes );
    if ( Llb_ManCountEntries(vNodes) == 0 )
        Vec_IntFreeP( &vNodes );
    Llb_ManDerefenceBdds( p, dd );
    Extra_StopManager( dd );
    return vNodes;
}